

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::ProcessHeadersMessage
          (PeerManagerImpl *this,CNode *pfrom,Peer *peer,
          vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers,bool via_compact_block)

{
  string_view source_file;
  string_view logging_function;
  span<const_CBlockHeader,_18446744073709551615UL> headers_00;
  byte bVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  byte bVar5;
  CNode *pfrom_00;
  CBlockIndex *pCVar6;
  ChainstateManager *this_00;
  CBlockIndex *chain_start_header_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  PeerManagerImpl *in_RCX;
  __extent_storage<18446744073709551615UL> in_RDX;
  CBlockLocator *in_RSI;
  ConstevalFormatString<3U> in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  undefined1 uVar7;
  undefined1 uVar8;
  bool received_new_header;
  CBlockIndex *last_received_header;
  bool headers_connect_blockindex;
  CBlockIndex *chain_start_header;
  bool have_headers_sync;
  bool already_validated_work;
  size_t nCount;
  CBlockIndex *pindexLast;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock71;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock69;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock68;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock67;
  BlockValidationState state;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> *in_stack_fffffffffffffd80;
  CBlockIndex *in_stack_fffffffffffffd88;
  PeerManagerImpl *in_stack_fffffffffffffd90;
  BlockManager *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  CBlockIndex *in_stack_fffffffffffffda8;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffdb0;
  undefined6 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  Params *in_stack_fffffffffffffdc0;
  CNode *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  string *message;
  LogFlags flag;
  BlockValidationState *state_00;
  int source_line;
  undefined6 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf6;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  PeerManagerImpl *in_stack_fffffffffffffe18;
  char *pcVar9;
  undefined7 in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe48;
  uint uVar10;
  undefined2 uVar11;
  undefined2 in_stack_fffffffffffffe60;
  byte bVar12;
  byte bVar13;
  undefined4 in_stack_fffffffffffffe64;
  Peer *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe78;
  PeerManagerImpl *peer_00;
  CBlockIndex *last_header;
  Peer *in_stack_fffffffffffffea0;
  CNode *in_stack_fffffffffffffea8;
  PeerManagerImpl *in_stack_fffffffffffffeb0;
  undefined1 local_119 [49];
  long local_e8;
  Level in_stack_ffffffffffffff20;
  undefined4 uStack_dc;
  int *in_stack_ffffffffffffff30;
  long *in_stack_ffffffffffffff38;
  atomic<int> *in_stack_ffffffffffffff40;
  BlockValidationState local_70;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_R8B & 1;
  last_header = (CBlockIndex *)in_RDI.fmt;
  pfrom_00 = (CNode *)std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::size
                                ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
                                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  if (pfrom_00 == (CNode *)0x0) {
    MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
               CONCAT17(in_stack_fffffffffffffdbf,
                        CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
               in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0
               ,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffd98 >> 0x18,0));
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    if (bVar2) {
      std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
                ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),(pointer)0x2ca83f);
      MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                 CONCAT17(in_stack_fffffffffffffdbf,
                          CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
                 in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
                 in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffd98 >> 0x18,0));
      CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      std::
      map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
      ::erase((map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
               *)in_stack_fffffffffffffd88,(key_type_conflict *)in_stack_fffffffffffffd80);
      UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    }
    std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::
    time_point((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    (((PeerManagerImpl *)in_RDX._M_extent_value)->m_opts).ignore_incoming_txs =
         (bool)(char)in_stack_ffffffffffffff20;
    (((PeerManagerImpl *)in_RDX._M_extent_value)->m_opts).reconcile_txs =
         (bool)(char)(in_stack_ffffffffffffff20 >> 8);
    *(short *)&(((PeerManagerImpl *)in_RDX._M_extent_value)->m_opts).field_0x2 =
         (short)(in_stack_ffffffffffffff20 >> 0x10);
    (((PeerManagerImpl *)in_RDX._M_extent_value)->m_opts).max_orphan_txs = uStack_dc;
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  }
  else {
    peer_00 = in_RCX;
    CChainParams::GetConsensus
              ((CChainParams *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    bVar2 = CheckHeadersPoW((PeerManagerImpl *)
                            CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                            (vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
                            in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                            (Peer *)CONCAT17(in_stack_fffffffffffffdbf,
                                             CONCAT16(in_stack_fffffffffffffdbe,
                                                      in_stack_fffffffffffffdb8)));
    if (bVar2) {
      local_e8 = 0;
      bVar12 = 0;
      MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                 CONCAT17(in_stack_fffffffffffffdbf,
                          CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
                 in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
                 in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffd98 >> 0x18,0));
      uVar3 = IsContinuationOfLowWorkHeadersSync
                        ((PeerManagerImpl *)in_RDX._M_extent_value,(Peer *)peer_00,
                         (CNode *)CONCAT17(bVar1,in_stack_fffffffffffffe78),
                         (vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)pfrom_00);
      bVar13 = uVar3;
      bVar2 = std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::empty
                        ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
                         in_stack_fffffffffffffd88);
      if (!bVar2) {
        bVar12 = std::unique_ptr::operator_cast_to_bool
                           ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
                            CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      }
      uVar10 = (uint)bVar2;
      UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      if (uVar10 == 0) {
        MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                  ((AnnotatedMixin<std::recursive_mutex> *)
                   CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        uVar11 = (undefined2)(uVar10 >> 0x10);
        pCVar6 = ProcessHeadersMessage::anon_class_16_2_fd929233::operator()
                           ((anon_class_16_2_fd929233 *)
                            CONCAT17(in_stack_fffffffffffffdbf,
                                     CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)))
        ;
        uVar7 = pCVar6 != (CBlockIndex *)0x0;
        if ((bool)uVar7) {
          std::chrono::
          time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::
          time_point((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          (((PeerManagerImpl *)in_RDX._M_extent_value)->m_opts).ignore_incoming_txs =
               (bool)local_119[0x19];
          (((PeerManagerImpl *)in_RDX._M_extent_value)->m_opts).reconcile_txs =
               (bool)local_119[0x1a];
          *(undefined2 *)&(((PeerManagerImpl *)in_RDX._M_extent_value)->m_opts).field_0x2 =
               local_119._27_2_;
          (((PeerManagerImpl *)in_RDX._M_extent_value)->m_opts).max_orphan_txs = local_119._29_4_;
          MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                    ((AnnotatedMixin<std::recursive_mutex> *)
                     CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                    ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                     CONCAT17(in_stack_fffffffffffffdbf,
                              CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
                     (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffdb0,
                     (char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                     (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffffd98 >> 0x18,0));
          this_00 = (ChainstateManager *)
                    (*(long *)&((CBlockIndex *)((long)in_RDI.fmt + 0x98))->nTime + 0x7f8);
          std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::back
                    ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
                     CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          CBlockHeader::GetHash((CBlockHeader *)in_stack_fffffffffffffd98);
          chain_start_header_00 =
               ::node::BlockManager::LookupBlockIndex
                         (in_stack_fffffffffffffd98,(uint256 *)in_stack_fffffffffffffd90);
          pCVar6 = chain_start_header_00;
          uVar4 = IsAncestorOfBestHeaderOrTip(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
          if ((bool)uVar4) {
            bVar13 = 1;
          }
          UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                    ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                     CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          bVar2 = CNode::HasPermission
                            ((CNode *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                             None);
          if (bVar2) {
            bVar13 = 1;
          }
          if (((bVar13 & 1) == 0) &&
             (bVar2 = TryLowWorkHeadersSync
                                (in_RCX,(Peer *)CONCAT17(uVar3,in_stack_fffffffffffffe08),
                                 (CNode *)this_00,chain_start_header_00,
                                 (vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
                                 CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffdf6,
                                                         in_stack_fffffffffffffdf0))), bVar2)) {
            local_119[0x18] =
                 std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::empty
                           ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
                            in_stack_fffffffffffffd88);
            inline_assertion_check<false,bool>
                      ((bool *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                       (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                       (char *)in_stack_fffffffffffffd80,
                       (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          }
          else {
            uVar3 = (undefined1)((ulong)chain_start_header_00 >> 0x38);
            uVar8 = pCVar6 == (CBlockIndex *)0x0;
            state_00 = &local_70;
            BlockValidationState::BlockValidationState
                      ((BlockValidationState *)
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
            flag._0_4_ = ((CBlockIndex *)((long)in_RDI.fmt + 0x98))->nTime;
            flag._4_4_ = ((CBlockIndex *)((long)in_RDI.fmt + 0x98))->nBits;
            std::span<const_CBlockHeader,_18446744073709551615UL>::
            span<std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_&>
                      ((span<const_CBlockHeader,_18446744073709551615UL> *)in_stack_fffffffffffffd88
                       ,in_stack_fffffffffffffd80);
            headers_00._M_extent._M_extent_value = in_RDX._M_extent_value;
            headers_00._M_ptr = (pointer)peer_00;
            uVar3 = ChainstateManager::ProcessNewBlockHeaders
                              (this_00,headers_00,(bool)uVar3,
                               (BlockValidationState *)
                               CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffdf6,
                                                       in_stack_fffffffffffffdf0)),
                               (CBlockIndex **)state_00);
            if (((bool)uVar3) ||
               (bVar2 = ValidationState<BlockValidationResult>::IsInvalid
                                  ((ValidationState<BlockValidationResult> *)
                                   CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)),
               !bVar2)) {
              source_line = (int)((ulong)state_00 >> 0x20);
              if (local_e8 == 0) {
                __assert_fail("pindexLast",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                              ,0xc6f,
                              "void (anonymous namespace)::PeerManagerImpl::ProcessHeadersMessage(CNode &, Peer &, std::vector<CBlockHeader> &&, bool)"
                             );
              }
              if ((pfrom_00 == (CNode *)(ulong)((CBlockIndex *)((long)in_RDI.fmt + 0x1c8))->nTx) &&
                 ((bVar12 & 1) == 0)) {
                GetLocator(in_stack_fffffffffffffda8);
                bVar5 = MaybeSendGetHeaders((PeerManagerImpl *)
                                            CONCAT17(in_stack_fffffffffffffdd7,
                                                     in_stack_fffffffffffffdd0),
                                            in_stack_fffffffffffffdc8,in_RSI,
                                            (Peer *)CONCAT17(in_stack_fffffffffffffdbf,
                                                             CONCAT16(in_stack_fffffffffffffdbe,
                                                                      in_stack_fffffffffffffdb8)));
                CBlockLocator::~CBlockLocator
                          ((CBlockLocator *)
                           CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
                if (((bVar5 & 1) != 0) &&
                   (bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffd7c,
                                                         in_stack_fffffffffffffd78),Trace), bVar2))
                {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
                  pcVar9 = "more getheaders (%d) to end to peer=%d (startheight:%d)\n";
                  in_stack_fffffffffffffea0 =
                       (Peer *)CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffd7c,
                                                              in_stack_fffffffffffffd78));
                  in_stack_fffffffffffffd78 = 1;
                  logging_function._M_str._0_7_ = in_stack_fffffffffffffe48;
                  logging_function._M_len = (size_t)pCVar6;
                  logging_function._M_str._7_1_ = uVar7;
                  source_file._M_str._0_7_ = in_stack_fffffffffffffe38;
                  source_file._M_len = (size_t)pcVar9;
                  source_file._M_str._7_1_ = uVar8;
                  LogPrintFormatInternal<int,long,std::atomic<int>>
                            (logging_function,source_file,source_line,flag,in_stack_ffffffffffffff20
                             ,in_RDI,in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
                             in_stack_ffffffffffffff40);
                }
              }
              UpdatePeerStateForReceivedHeaders
                        ((PeerManagerImpl *)CONCAT17(bVar1,in_stack_fffffffffffffe78),pfrom_00,
                         in_stack_fffffffffffffe68,
                         (CBlockIndex *)
                         CONCAT44(in_stack_fffffffffffffe64,
                                  CONCAT13(bVar13,CONCAT12(bVar12,in_stack_fffffffffffffe60))),
                         SUB21((ushort)uVar11 >> 8,0),SUB21(uVar11,0));
              HeadersDirectFetchBlocks
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0,last_header);
            }
            else {
              this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffd7c,
                                                       in_stack_fffffffffffffd78));
              uVar7 = (undefined1)((ulong)flag >> 0x38);
              message = (string *)local_119;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (this_01,(char *)in_stack_fffffffffffffdc0,
                         (allocator<char> *)
                         CONCAT17(in_stack_fffffffffffffdbf,
                                  CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)));
              MaybePunishNodeForBlock
                        ((PeerManagerImpl *)
                         CONCAT17(uVar4,CONCAT16(uVar3,in_stack_fffffffffffffdf0)),
                         (NodeId)in_RDI.fmt,state_00,(bool)uVar7,message);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
              std::allocator<char>::~allocator((allocator<char> *)local_119);
            }
            BlockValidationState::~BlockValidationState
                      ((BlockValidationState *)
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          }
        }
        else {
          HandleUnconnectingHeaders
                    (in_stack_fffffffffffffe18,(CNode *)in_RCX,
                     (Peer *)CONCAT17(uVar3,in_stack_fffffffffffffe08),in_stack_fffffffffffffe00);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessHeadersMessage(CNode& pfrom, Peer& peer,
                                            std::vector<CBlockHeader>&& headers,
                                            bool via_compact_block)
{
    size_t nCount = headers.size();

    if (nCount == 0) {
        // Nothing interesting. Stop asking this peers for more headers.
        // If we were in the middle of headers sync, receiving an empty headers
        // message suggests that the peer suddenly has nothing to give us
        // (perhaps it reorged to our chain). Clear download state for this peer.
        LOCK(peer.m_headers_sync_mutex);
        if (peer.m_headers_sync) {
            peer.m_headers_sync.reset(nullptr);
            LOCK(m_headers_presync_mutex);
            m_headers_presync_stats.erase(pfrom.GetId());
        }
        // A headers message with no headers cannot be an announcement, so assume
        // it is a response to our last getheaders request, if there is one.
        peer.m_last_getheaders_timestamp = {};
        return;
    }

    // Before we do any processing, make sure these pass basic sanity checks.
    // We'll rely on headers having valid proof-of-work further down, as an
    // anti-DoS criteria (note: this check is required before passing any
    // headers into HeadersSyncState).
    if (!CheckHeadersPoW(headers, m_chainparams.GetConsensus(), peer)) {
        // Misbehaving() calls are handled within CheckHeadersPoW(), so we can
        // just return. (Note that even if a header is announced via compact
        // block, the header itself should be valid, so this type of error can
        // always be punished.)
        return;
    }

    const CBlockIndex *pindexLast = nullptr;

    // We'll set already_validated_work to true if these headers are
    // successfully processed as part of a low-work headers sync in progress
    // (either in PRESYNC or REDOWNLOAD phase).
    // If true, this will mean that any headers returned to us (ie during
    // REDOWNLOAD) can be validated without further anti-DoS checks.
    bool already_validated_work = false;

    // If we're in the middle of headers sync, let it do its magic.
    bool have_headers_sync = false;
    {
        LOCK(peer.m_headers_sync_mutex);

        already_validated_work = IsContinuationOfLowWorkHeadersSync(peer, pfrom, headers);

        // The headers we passed in may have been:
        // - untouched, perhaps if no headers-sync was in progress, or some
        //   failure occurred
        // - erased, such as if the headers were successfully processed and no
        //   additional headers processing needs to take place (such as if we
        //   are still in PRESYNC)
        // - replaced with headers that are now ready for validation, such as
        //   during the REDOWNLOAD phase of a low-work headers sync.
        // So just check whether we still have headers that we need to process,
        // or not.
        if (headers.empty()) {
            return;
        }

        have_headers_sync = !!peer.m_headers_sync;
    }

    // Do these headers connect to something in our block index?
    const CBlockIndex *chain_start_header{WITH_LOCK(::cs_main, return m_chainman.m_blockman.LookupBlockIndex(headers[0].hashPrevBlock))};
    bool headers_connect_blockindex{chain_start_header != nullptr};

    if (!headers_connect_blockindex) {
        // This could be a BIP 130 block announcement, use
        // special logic for handling headers that don't connect, as this
        // could be benign.
        HandleUnconnectingHeaders(pfrom, peer, headers);
        return;
    }

    // If headers connect, assume that this is in response to any outstanding getheaders
    // request we may have sent, and clear out the time of our last request. Non-connecting
    // headers cannot be a response to a getheaders request.
    peer.m_last_getheaders_timestamp = {};

    // If the headers we received are already in memory and an ancestor of
    // m_best_header or our tip, skip anti-DoS checks. These headers will not
    // use any more memory (and we are not leaking information that could be
    // used to fingerprint us).
    const CBlockIndex *last_received_header{nullptr};
    {
        LOCK(cs_main);
        last_received_header = m_chainman.m_blockman.LookupBlockIndex(headers.back().GetHash());
        if (IsAncestorOfBestHeaderOrTip(last_received_header)) {
            already_validated_work = true;
        }
    }

    // If our peer has NetPermissionFlags::NoBan privileges, then bypass our
    // anti-DoS logic (this saves bandwidth when we connect to a trusted peer
    // on startup).
    if (pfrom.HasPermission(NetPermissionFlags::NoBan)) {
        already_validated_work = true;
    }

    // At this point, the headers connect to something in our block index.
    // Do anti-DoS checks to determine if we should process or store for later
    // processing.
    if (!already_validated_work && TryLowWorkHeadersSync(peer, pfrom,
                chain_start_header, headers)) {
        // If we successfully started a low-work headers sync, then there
        // should be no headers to process any further.
        Assume(headers.empty());
        return;
    }

    // At this point, we have a set of headers with sufficient work on them
    // which can be processed.

    // If we don't have the last header, then this peer will have given us
    // something new (if these headers are valid).
    bool received_new_header{last_received_header == nullptr};

    // Now process all the headers.
    BlockValidationState state;
    if (!m_chainman.ProcessNewBlockHeaders(headers, /*min_pow_checked=*/true, state, &pindexLast)) {
        if (state.IsInvalid()) {
            MaybePunishNodeForBlock(pfrom.GetId(), state, via_compact_block, "invalid header received");
            return;
        }
    }
    assert(pindexLast);

    // Consider fetching more headers if we are not using our headers-sync mechanism.
    if (nCount == m_opts.max_headers_result && !have_headers_sync) {
        // Headers message had its maximum size; the peer may have more headers.
        if (MaybeSendGetHeaders(pfrom, GetLocator(pindexLast), peer)) {
            LogDebug(BCLog::NET, "more getheaders (%d) to end to peer=%d (startheight:%d)\n",
                    pindexLast->nHeight, pfrom.GetId(), peer.m_starting_height);
        }
    }

    UpdatePeerStateForReceivedHeaders(pfrom, peer, *pindexLast, received_new_header, nCount == m_opts.max_headers_result);

    // Consider immediately downloading blocks.
    HeadersDirectFetchBlocks(pfrom, peer, *pindexLast);

    return;
}